

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O0

DataType __thiscall
adios2::format::BP5Deserializer::TranslateFFSType2ADIOS(BP5Deserializer *this,char *Type,int size)

{
  int iVar1;
  int in_EDX;
  char *in_RSI;
  
  iVar1 = strcmp(in_RSI,"integer");
  if (iVar1 == 0) {
    if (in_EDX == 1) {
      return Int8;
    }
    if (in_EDX == 2) {
      return Int16;
    }
    if (in_EDX == 4) {
      return Int32;
    }
    if (in_EDX == 8) {
      return Int64;
    }
  }
  else {
    iVar1 = strcmp(in_RSI,"unsigned integer");
    if (iVar1 == 0) {
      if (in_EDX == 1) {
        return UInt8;
      }
      if (in_EDX == 2) {
        return UInt16;
      }
      if (in_EDX == 4) {
        return UInt32;
      }
      if (in_EDX == 8) {
        return UInt64;
      }
    }
    else {
      iVar1 = strcmp(in_RSI,"double");
      if ((iVar1 == 0) || (iVar1 = strcmp(in_RSI,"float"), iVar1 == 0)) {
        if (in_EDX == 4) {
          return Float;
        }
        if (in_EDX == 0x10) {
          return LongDouble;
        }
        return Double;
      }
      iVar1 = strcmp(in_RSI,"complex4");
      if (iVar1 == 0) {
        return FloatComplex;
      }
      iVar1 = strcmp(in_RSI,"complex8");
      if (iVar1 == 0) {
        return DoubleComplex;
      }
      iVar1 = strcmp(in_RSI,"string");
      if (iVar1 == 0) {
        return String;
      }
    }
  }
  return None;
}

Assistant:

DataType BP5Deserializer::TranslateFFSType2ADIOS(const char *Type, int size)
{
    if (strcmp(Type, "integer") == 0)
    {
        if (size == 1)
        {
            return DataType::Int8;
        }
        else if (size == 2)
        {
            return DataType::Int16;
        }
        else if (size == 4)
        {
            return DataType::Int32;
        }
        else if (size == 8)
        {
            return DataType::Int64;
        }
    }
    else if (strcmp(Type, "unsigned integer") == 0)
    {
        if (size == 1)
        {
            return DataType::UInt8;
        }
        else if (size == 2)
        {
            return DataType::UInt16;
        }
        else if (size == 4)
        {
            return DataType::UInt32;
        }
        else if (size == 8)
        {
            return DataType::UInt64;
        }
    }
    else if ((strcmp(Type, "double") == 0) || (strcmp(Type, "float") == 0))
    {
        if (size == sizeof(float))
        {
            return DataType::Float;
        }
        else if ((sizeof(long double) != sizeof(double)) && (size == sizeof(long double)))
        {
            return DataType::LongDouble;
        }
        else
        {
            return DataType::Double;
        }
    }
    else if (strcmp(Type, "complex4") == 0)
    {
        return DataType::FloatComplex;
    }
    else if (strcmp(Type, "complex8") == 0)
    {
        return DataType::DoubleComplex;
    }
    else if (strcmp(Type, "string") == 0)
    {
        return DataType::String;
    }

    return DataType::None;
}